

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChColor.cpp
# Opt level: O1

ChColor chrono::ChColor::ComputeFalseColor(double v,double vmin,double vmax,bool out_of_range_as_bw)

{
  double dVar1;
  float *pfVar2;
  int in_ESI;
  undefined7 in_register_00000039;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar7 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar8 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar9 [64];
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  ChColor CVar14;
  
  auVar9._8_56_ = in_register_00001288;
  auVar9._0_8_ = vmax;
  auVar8._8_56_ = in_register_00001248;
  auVar8._0_8_ = vmin;
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = v;
  pfVar2 = (float *)CONCAT71(in_register_00000039,out_of_range_as_bw);
  if (in_ESI != 0) {
    fVar10 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    if (v < vmin) goto LAB_0083e335;
    if (vmax < v) {
      fVar12 = 1.0;
      fVar10 = 1.0;
      fVar13 = 1.0;
      goto LAB_0083e335;
    }
  }
  auVar6 = auVar8._0_16_;
  auVar7 = vmaxsd_avx(auVar6,auVar5._0_16_);
  auVar7 = vminsd_avx(auVar9._0_16_,auVar7);
  dVar1 = vmax - vmin;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0x3fd0000000000000),auVar3,auVar6);
  dVar11 = auVar7._0_8_;
  if (auVar4._0_8_ <= dVar11) {
    auVar7 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar3,auVar6);
    if (auVar7._0_8_ <= dVar11) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar1;
      auVar7 = vfmadd213sd_fma(ZEXT816(0x3fe8000000000000),auVar4,auVar6);
      if (auVar7._0_8_ <= dVar11) {
        dVar11 = (auVar7._0_8_ - dVar11) * 4.0;
        auVar8 = ZEXT864((ulong)dVar11);
        v = dVar11 / dVar1 + 1.0;
        fVar12 = (float)v;
        fVar13 = 0.0;
        fVar10 = 1.0;
      }
      else {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar11 - vmin;
        auVar7 = vfmadd231sd_fma(auVar7,auVar4,ZEXT816(0xbfe0000000000000));
        dVar11 = auVar7._0_8_ * 4.0;
        auVar8 = ZEXT864((ulong)dVar11);
        v = dVar11 / dVar1;
        fVar10 = (float)v;
        fVar13 = 0.0;
        fVar12 = 1.0;
      }
      goto LAB_0083e335;
    }
    dVar11 = (auVar4._0_8_ - dVar11) * 4.0;
    v = dVar11 / dVar1 + 1.0;
    fVar13 = (float)v;
    fVar12 = 1.0;
  }
  else {
    dVar11 = (dVar11 - vmin) * 4.0;
    v = dVar11 / dVar1;
    fVar12 = (float)v;
    fVar13 = 1.0;
  }
  auVar8 = ZEXT864((ulong)dVar11);
  fVar10 = 0.0;
LAB_0083e335:
  *pfVar2 = fVar10;
  pfVar2[1] = fVar12;
  pfVar2[2] = fVar13;
  CVar14.B = auVar8._0_4_;
  CVar14._0_8_ = v;
  return CVar14;
}

Assistant:

ChColor ChColor::ComputeFalseColor(double v, double vmin, double vmax, bool out_of_range_as_bw) {
    ChColor c = {1.0, 1.0, 1.0};  // default white
    double dv;

    if (out_of_range_as_bw) {
        if (v < vmin)
            return ChColor(0, 0, 0);
        if (v > vmax)
            return ChColor(1, 1, 1);
    }

    if (v < vmin)
        v = vmin;
    if (v > vmax)
        v = vmax;
    dv = vmax - vmin;

    if (v < (vmin + 0.25 * dv)) {
        c.R = 0;
        c.G = (float)(4 * (v - vmin) / dv);
    } else if (v < (vmin + 0.5 * dv)) {
        c.R = 0;
        c.B = (float)(1 + 4 * (vmin + 0.25 * dv - v) / dv);
    } else if (v < (vmin + 0.75 * dv)) {
        c.R = (float)(4 * (v - vmin - 0.5 * dv) / dv);
        c.B = 0;
    } else {
        c.G = (float)(1 + 4 * (vmin + 0.75 * dv - v) / dv);
        c.B = 0;
    }

    return (c);
}